

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_create_unk34(nvrm_ioctl_create_unk34 *s)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  nvrm_ioctl_create_unk34 *s_local;
  
  if ((s->cid != 0) || (iVar2 = _nvrm_field_enabled("cid"), iVar2 != 0)) {
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
    if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
      fprintf(_stdout,"%shandle: 0x%08x",nvrm_pfx,(ulong)s->handle);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  if ((s->parent != 0) || (iVar2 = _nvrm_field_enabled("parent"), iVar2 != 0)) {
    if ((s->parent != 0) || (iVar2 = _nvrm_field_enabled("parent"), iVar2 != 0)) {
      fprintf(_stdout,"%sparent: 0x%08x",nvrm_pfx,(ulong)s->parent);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  if ((s->cid2 != 0) || (iVar2 = _nvrm_field_enabled("cid2"), iVar2 != 0)) {
    fprintf(_stdout,"%scid2: 0x%08x",nvrm_pfx,(ulong)s->cid2);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle2 != 0) || (iVar2 = _nvrm_field_enabled("handle2"), iVar2 != 0)) {
    if ((s->handle2 != 0) || (iVar2 = _nvrm_field_enabled("handle2"), iVar2 != 0)) {
      fprintf(_stdout,"%shandle2: 0x%08x",nvrm_pfx,(ulong)s->handle2);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid2,s->handle2,"handle2");
  }
  if ((s->unk14 != 0) || (iVar2 = _nvrm_field_enabled("unk14"), iVar2 != 0)) {
    fprintf(_stdout,"%sunk14: 0x%08x",nvrm_pfx,(ulong)s->unk14);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->status != 0) || (iVar2 = _nvrm_field_enabled("status"), iVar2 != 0)) {
    __stream = _stdout;
    pcVar1 = nvrm_pfx;
    pcVar3 = nvrm_status(s->status);
    fprintf(__stream,"%sstatus: %s",pcVar1,pcVar3);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_unk34(struct nvrm_ioctl_create_unk34 *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_cid(s, cid2);
	nvrm_print_handle(s, handle2, cid2);
	nvrm_print_x32(s, unk14);
	nvrm_print_status(s, status);
	nvrm_print_ln();
}